

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrinsic_geometry_interface.cpp
# Opt level: O2

void __thiscall
geometrycentral::surface::ExtrinsicGeometryInterface::computeVertexPrincipalCurvatureDirections
          (ExtrinsicGeometryInterface *this)

{
  Vector2 VVar1;
  ulong uVar2;
  Vector2 *pVVar3;
  undefined1 auVar4 [16];
  size_t sVar5;
  size_t i;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  NavigationIteratorBase<geometrycentral::surface::VertexOutgoingHalfedgeNavigator> __begin3;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> __begin2;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> __end2;
  NavigationIteratorBase<geometrycentral::surface::VertexOutgoingHalfedgeNavigator> local_d0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> local_98;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> local_80;
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector2> local_68;
  
  DependentQuantity::ensureHave
            (&(this->super_IntrinsicGeometryInterface).edgeLengthsQ.super_DependentQuantity);
  DependentQuantity::ensureHave
            (&(this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertexQ.
              super_DependentQuantity);
  DependentQuantity::ensureHave(&(this->edgeDihedralAnglesQ).super_DependentQuantity);
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector2>::MeshData
            (&local_68,(this->super_IntrinsicGeometryInterface).super_BaseGeometryInterface.mesh);
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector2>::operator=
            (&this->vertexPrincipalCurvatureDirections,&local_68);
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector2>::~MeshData(&local_68);
  local_68.mesh = (this->super_IntrinsicGeometryInterface).super_BaseGeometryInterface.mesh;
  local_68.defaultValue.y = (double)(local_68.mesh)->nVerticesFillCount;
  local_68.defaultValue.x = 0.0;
  RangeSetBase<geometrycentral::surface::VertexRangeF>::begin
            (&local_98,(RangeSetBase<geometrycentral::surface::VertexRangeF> *)&local_68);
  RangeSetBase<geometrycentral::surface::VertexRangeF>::end
            (&local_80,(RangeSetBase<geometrycentral::surface::VertexRangeF> *)&local_68);
  local_a8 = 0.25;
  dStack_a0 = 0.25;
  while (sVar5 = local_98.iCurr, local_98.iCurr != local_80.iCurr) {
    local_b8 = 0.0;
    dStack_b0 = 0.0;
    uVar2 = ((local_98.mesh)->vHalfedgeArr).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[local_98.iCurr];
    local_d0.state.currE.
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh =
         local_98.mesh;
    local_d0.justStarted = true;
    local_d0.state.currE.
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
         uVar2;
    while ((local_d0.justStarted != false ||
           (local_d0.state.currE.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .ind != uVar2))) {
      if ((local_d0.state.currE.
           super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          mesh)->useImplicitTwinFlag == true) {
        uVar6 = local_d0.state.currE.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .ind >> 1;
      }
      else {
        uVar6 = ((local_d0.state.currE.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .mesh)->heEdgeArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start
                [local_d0.state.currE.
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 .ind];
      }
      pVVar3 = (this->super_IntrinsicGeometryInterface).halfedgeVectorsInVertex.data.
               super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      dVar9 = 1.0 / (this->super_IntrinsicGeometryInterface).edgeLengths.data.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                    [uVar6];
      auVar11._8_8_ = 0;
      auVar11._0_8_ =
           pVVar3[local_d0.state.currE.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                  .ind].y;
      VVar1 = pVVar3[local_d0.state.currE.
                     super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                     .ind];
      auVar8._8_8_ = 0x8000000000000000;
      auVar8._0_8_ = 0x8000000000000000;
      auVar7 = vxorpd_avx512vl(auVar11,auVar8);
      auVar8 = vshufpd_avx((undefined1  [16])VVar1,(undefined1  [16])VVar1,1);
      auVar7 = vshufpd_avx((undefined1  [16])VVar1,auVar7,1);
      auVar12._0_8_ = auVar8._0_8_ * auVar7._0_8_;
      auVar12._8_8_ = auVar8._8_8_ * auVar7._8_8_;
      auVar7._8_8_ = pVVar3[local_d0.state.currE.
                            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                            .ind].x;
      auVar7._0_8_ = pVVar3[local_d0.state.currE.
                            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                            .ind].x;
      auVar8 = vfnmadd231pd_avx512vl(auVar12,(undefined1  [16])VVar1,auVar7);
      auVar10._0_8_ = dVar9 * auVar8._0_8_;
      auVar10._8_8_ = dVar9 * auVar8._8_8_;
      dVar9 = (this->edgeDihedralAngles).data.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar6]
      ;
      auVar4._8_8_ = dVar9;
      auVar4._0_8_ = dVar9;
      auVar8 = vmulpd_avx512vl(auVar10,auVar4);
      local_b8 = local_b8 + auVar8._0_8_;
      dStack_b0 = dStack_b0 + auVar8._8_8_;
      NavigationIteratorBase<geometrycentral::surface::VertexOutgoingHalfedgeNavigator>::operator++
                (&local_d0);
    }
    pVVar3 = (this->vertexPrincipalCurvatureDirections).data.
             super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
             m_storage.m_data + sVar5;
    pVVar3->x = local_b8 * local_a8;
    pVVar3->y = dStack_b0 * dStack_a0;
    RangeIteratorBase<geometrycentral::surface::VertexRangeF>::operator++(&local_98);
  }
  return;
}

Assistant:

void ExtrinsicGeometryInterface::computeVertexPrincipalCurvatureDirections() {
  edgeLengthsQ.ensureHave();
  halfedgeVectorsInVertexQ.ensureHave();
  edgeDihedralAnglesQ.ensureHave();

  vertexPrincipalCurvatureDirections = VertexData<Vector2>(mesh);

  for (Vertex v : mesh.vertices()) {
    Vector2 principalDir{0.0, 0.0};
    for (Halfedge he : v.outgoingHalfedges()) {
      double len = edgeLengths[he.edge()];
      double alpha = edgeDihedralAngles[he.edge()];
      Vector2 vec = halfedgeVectorsInVertex[he];
      principalDir += -vec * vec / len * alpha;
    }

    vertexPrincipalCurvatureDirections[v] = principalDir / 4;
  }
}